

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O1

Value * cmFileAPICMakeFilesDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  pointer pcVar1;
  size_t __n;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  Value *pVVar7;
  pointer ppcVar8;
  pointer cSubdir;
  CMakeFiles cmakeFiles;
  string path;
  string local_1b8;
  string *local_198;
  string *local_190;
  char local_188;
  string local_180;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  ValueHolder local_a8 [2];
  CommentInfo *local_98 [3];
  Value local_80;
  Value local_58;
  
  psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_1b8);
  local_198 = cmake::GetHomeDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  local_190 = cmake::GetHomeOutputDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  __n = local_190->_M_string_length;
  local_188 = true;
  if (__n == local_198->_M_string_length) {
    if (__n == 0) {
      local_188 = false;
    }
    else {
      iVar5 = bcmp((local_190->_M_dataplus)._M_p,(local_198->_M_dataplus)._M_p,__n);
      local_188 = iVar5 != 0;
    }
  }
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_148,objectValue);
  Json::Value::Value(&local_f8,local_198);
  pVVar7 = Json::Value::operator[](&local_148,"source");
  Json::Value::operator=(pVVar7,&local_f8);
  Json::Value::~Value(&local_f8);
  Json::Value::Value(&local_120,local_190);
  pVVar7 = Json::Value::operator[](&local_148,"build");
  Json::Value::operator=(pVVar7,&local_120);
  Json::Value::~Value(&local_120);
  pVVar7 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar7,&local_148);
  Json::Value::~Value(&local_148);
  Json::Value::Value(&local_d0,arrayValue);
  pcVar2 = fileAPI->CMakeInstance->GlobalGenerator;
  ppcVar8 = (pcVar2->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_160 = (pcVar2->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppcVar8 != local_160) {
    do {
      cSubdir = ((*ppcVar8)->Makefile->ListFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_150 = ((*ppcVar8)->Makefile->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_158 = ppcVar8;
      if (cSubdir != local_150) {
        do {
          Json::Value::Value(&local_80,objectValue);
          bVar3 = cmsys::SystemTools::IsSubDirectory(cSubdir,&local_1b8);
          if (bVar3) {
            Json::Value::Value(&local_f8,true);
            pVVar7 = Json::Value::operator[](&local_80,"isCMake");
            Json::Value::operator=(pVVar7,&local_f8);
            Json::Value::~Value(&local_f8);
          }
          bVar4 = cmsys::SystemTools::IsSubDirectory(cSubdir,local_198);
          if (!bVar4) {
            bVar4 = cmsys::SystemTools::IsSubDirectory(cSubdir,local_190);
            if (!bVar4) {
              Json::Value::Value(&local_120,true);
              pVVar7 = Json::Value::operator[](&local_80,"isExternal");
              Json::Value::operator=(pVVar7,&local_120);
              Json::Value::~Value(&local_120);
            }
          }
          if (local_188 == '\x01') {
            bVar4 = cmsys::SystemTools::IsSubDirectory(cSubdir,local_190);
            if (bVar4) {
              Json::Value::Value(&local_58,true);
              pVVar7 = Json::Value::operator[](&local_80,"isGenerated");
              Json::Value::operator=(pVVar7,&local_58);
              Json::Value::~Value(&local_58);
            }
          }
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          pcVar1 = (cSubdir->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,pcVar1,pcVar1 + cSubdir->_M_string_length);
          if (!bVar3) {
            bVar3 = cmsys::SystemTools::IsSubDirectory(&local_180,local_198);
            if (bVar3) {
              cmSystemTools::RelativePath((string *)local_a8,local_198,&local_180);
              std::__cxx11::string::operator=((string *)&local_180,(string *)&local_a8[0].bool_);
              if (local_a8[0] != local_98) {
                operator_delete(local_a8[0].string_,(ulong)((long)&local_98[0]->comment_ + 1));
              }
            }
          }
          Json::Value::Value((Value *)local_a8,&local_180);
          pVVar7 = Json::Value::operator[](&local_80,"path");
          Json::Value::operator=(pVVar7,(Value *)local_a8);
          Json::Value::~Value((Value *)local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          Json::Value::append(&local_d0,&local_80);
          Json::Value::~Value(&local_80);
          cSubdir = cSubdir + 1;
        } while (cSubdir != local_150);
      }
      ppcVar8 = local_158 + 1;
    } while (ppcVar8 != local_160);
  }
  pVVar7 = Json::Value::operator[](__return_storage_ptr__,"inputs");
  Json::Value::operator=(pVVar7,&local_d0);
  Json::Value::~Value(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPICMakeFilesDump(cmFileAPI& fileAPI, unsigned long version)
{
  CMakeFiles cmakeFiles(fileAPI, version);
  return cmakeFiles.Dump();
}